

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteMemory(CWriter *this,string *name,Memory *memory)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  bVar1 = (memory->page_limits).is_shared;
  pcVar3 = "wasm_rt_memory_t";
  if (bVar1 != false) {
    pcVar3 = "wasm_rt_shared_memory_t";
  }
  pcVar2 = pcVar3 + 0x10;
  if (bVar1 != false) {
    pcVar2 = pcVar3 + 0x17;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar3,pcVar2);
  WriteData(this,(char *)local_40,local_38);
  WriteData(this," ",1);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,name,(char (*) [2])0x171bb9);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void CWriter::WriteMemory(const std::string& name, const Memory& memory) {
  Write(GetMemoryTypeString(memory), " ", name, ";");
}